

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O0

void __thiscall
ot::commissioner::coap::CoapTest_CoapMessageConfirmable_BasicSendRecv_Test::TestBody
          (CoapTest_CoapMessageConfirmable_BasicSendRecv_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_a28;
  Message local_a20;
  int local_a18;
  int local_a14;
  undefined1 local_a10 [8];
  AssertionResult gtest_ar_5;
  ResponseHandler local_9f8;
  allocator local_9d1;
  string local_9d0;
  AssertHelper local_9b0;
  Message local_9a8;
  ErrorCode local_99c;
  Error local_998;
  undefined1 local_970 [8];
  AssertionResult gtest_ar_4;
  Message local_958;
  ErrorCode local_950;
  allocator local_949;
  string local_948;
  Error local_928;
  undefined1 local_900 [8];
  AssertionResult gtest_ar_3;
  Message request;
  Message local_860;
  ErrorCode local_854;
  anon_class_8_1_a7c0f516 local_850;
  RequestHandler local_848;
  allocator local_821;
  string local_820;
  Resource local_800;
  Error local_7c0;
  undefined1 local_798 [8];
  AssertionResult gtest_ar_2;
  Coap coap1;
  Coap coap0;
  MockEndpoint peer1;
  MockEndpoint peer0;
  Message local_d0;
  void *local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  event_base *eventBase;
  Message local_a0;
  ErrorCode local_98 [5];
  allocator local_81;
  string local_80;
  Error local_60;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  Address localhost;
  CoapTest_CoapMessageConfirmable_BasicSendRecv_Test *this_local;
  
  Address::Address((Address *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"127.0.0.1",&local_81);
  Address::Set(&local_60,(Address *)&gtest_ar.message_,&local_80);
  local_98[0] = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_38,"localhost.Set(\"127.0.0.1\")","ErrorCode::kNone",&local_60,
             local_98);
  Error::~Error(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&eventBase,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x16d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&eventBase,&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&eventBase);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )event_base_new();
  local_c8 = (void *)0x0;
  testing::internal::CmpHelperNE<event_base*,decltype(nullptr)>
            ((internal *)local_c0,"eventBase","nullptr",(event_base **)&gtest_ar_1.message_,
             &local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               ((long)&peer0.mSendQueue.c.
                       super__Deque_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish + 0x18),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x170,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               ((long)&peer0.mSendQueue.c.
                       super__Deque_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish + 0x18),&local_d0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               ((long)&peer0.mSendQueue.c.
                       super__Deque_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish + 0x18));
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  MockEndpoint::MockEndpoint
            ((MockEndpoint *)
             ((long)&peer1.mSendQueue.c.
                     super__Deque_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18),
             (event_base *)
             gtest_ar_1.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,(Address *)&gtest_ar.message_,0x1633);
  MockEndpoint::MockEndpoint
            ((MockEndpoint *)&coap0.mEndpoint,
             (event_base *)
             gtest_ar_1.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,(Address *)&gtest_ar.message_,0x1634);
  MockEndpoint::SetPeer
            ((MockEndpoint *)
             ((long)&peer1.mSendQueue.c.
                     super__Deque_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18),
             (MockEndpoint *)&coap0.mEndpoint);
  MockEndpoint::SetPeer
            ((MockEndpoint *)&coap0.mEndpoint,
             (MockEndpoint *)
             ((long)&peer1.mSendQueue.c.
                     super__Deque_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  Coap::Coap((Coap *)&coap1.mEndpoint,
             (event_base *)
             gtest_ar_1.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,
             (Endpoint *)
             ((long)&peer1.mSendQueue.c.
                     super__Deque_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  Coap::Coap((Coap *)&gtest_ar_2.message_,
             (event_base *)
             gtest_ar_1.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,(Endpoint *)&coap0.mEndpoint);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_820,"/hello",&local_821);
  local_850.coap1 = (Coap *)&gtest_ar_2.message_;
  std::function<void(ot::commissioner::coap::Message_const&)>::
  function<ot::commissioner::coap::CoapTest_CoapMessageConfirmable_BasicSendRecv_Test::TestBody()::__0,void>
            ((function<void(ot::commissioner::coap::Message_const&)> *)&local_848,&local_850);
  Resource::Resource(&local_800,&local_820,&local_848);
  Coap::AddResource(&local_7c0,(Coap *)&gtest_ar_2.message_,&local_800);
  local_854 = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_798,
             "coap1.AddResource({\"/hello\", [&coap1](const Request &aRequest) { switch (0) case 0: default: if (const ::testing::AssertionResult gtest_ar_ = ::testing::AssertionResult(aRequest.IsRequest())) ; else ::testing::internal::AssertHelper(::testing::TestPartResult::kNonFatalFailure, \"/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp\", 380, ::testing::internal::GetBoolAssertionFailureMessage( gtest_ar_, \"aRequest.IsRequest()\", \"false\", \"true\").c_str()) = ::testing::Message(); switch (0) case 0: default: if (const ::testing::AssertionResult gtest_ar = (::testing::internal::EqHelper::Compare(\"aRequest.GetType()\", \"Type::kConfirmable\", aRequest.GetType(), Type::kConfirmable))) ; else ::testing::internal::AssertHelper(::testing::TestPartResult::kNonFatalFailure, \"/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp\", 381, gtest_ar.failure_message()) = ::testing::Message(); switch (0) case 0: default: if (const ::testing::AssertionResult gtest_ar = (::testing::internal::EqHelper::Compare(\"aRequest.GetCode()\", \"Code::kGet\", aRequest.GetCode(), Code::kGet))) ; else ::testing::internal::AssertHelper(::testing::TestPartResult::kNonFatalFailure, \"/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp\", 382, gtest_ar.failure_message()) = ::testing::Message(); ContentFormat contentFormat; switch (0) case 0: default: if (const ::testing::AssertionResult gtest_ar = (::testing::internal::EqHelper::Compare(\"aRequest.GetContentFormat(contentFormat)\", \"ErrorCode::kNone\", aRequest.GetContentFormat(contentFormat), ErrorCode::kNone))) ; else ::testing::internal::AssertHelper(::testing::TestPartResult::kNonFatalFailure, \"/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp\", 385, gtest_ar.failure_message()) = ::testing::Message(); switch (0) case 0: default: if (const ::testing::AssertionResult gtest_ar = (::testing::internal::EqHelper:..." /* TRUNCATED STRING LITERAL */
             ,"ErrorCode::kNone",&local_7c0,&local_854);
  Error::~Error(&local_7c0);
  Resource::~Resource(&local_800);
  std::function<void_(const_ot::commissioner::coap::Message_&)>::~function(&local_848);
  std::__cxx11::string::~string((string *)&local_820);
  std::allocator<char>::~allocator((allocator<char> *)&local_821);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_798);
  if (!bVar1) {
    testing::Message::Message(&local_860);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_798);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&request.mEndpoint,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,399,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&request.mEndpoint,&local_860);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&request.mEndpoint);
    testing::Message::~Message(&local_860);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_798);
  Message::Message((Message *)&gtest_ar_3.message_,kConfirmable,kGet);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_948,"/hello",&local_949);
  Message::SetUriPath(&local_928,(Message *)&gtest_ar_3.message_,&local_948);
  local_950 = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_900,"request.SetUriPath(\"/hello\")","ErrorCode::kNone",&local_928,
             &local_950);
  Error::~Error(&local_928);
  std::__cxx11::string::~string((string *)&local_948);
  std::allocator<char>::~allocator((allocator<char> *)&local_949);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_900);
  if (!bVar1) {
    testing::Message::Message(&local_958);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_900);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x192,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_958);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_900);
  Message::SetContentFormat(&local_998,(Message *)&gtest_ar_3.message_,kTextPlain);
  local_99c = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_970,"request.SetContentFormat(ContentFormat::kTextPlain)",
             "ErrorCode::kNone",&local_998,&local_99c);
  Error::~Error(&local_998);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_970);
  if (!bVar1) {
    testing::Message::Message(&local_9a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_970);
    testing::internal::AssertHelper::AssertHelper
              (&local_9b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x193,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9b0,&local_9a8);
    testing::internal::AssertHelper::~AssertHelper(&local_9b0);
    testing::Message::~Message(&local_9a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_970);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_9d0,"hello, CoAP",&local_9d1);
  Message::Append((Message *)&gtest_ar_3.message_,&local_9d0);
  std::__cxx11::string::~string((string *)&local_9d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9d1);
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )&gtest_ar_1.message_;
  std::function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>::
  function<ot::commissioner::coap::CoapTest_CoapMessageConfirmable_BasicSendRecv_Test::TestBody()::__1,void>
            ((function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)> *)
             &local_9f8,(anon_class_8_1_176f972b *)&gtest_ar_5.message_);
  Coap::SendRequest((Coap *)&coap1.mEndpoint,(Request *)&gtest_ar_3.message_,&local_9f8);
  std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::~function
            (&local_9f8);
  local_a14 = event_base_loop((event_base *)
                              gtest_ar_1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl,4);
  local_a18 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_a10,"event_base_loop(eventBase, 0x04)","0",&local_a14,&local_a18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a10);
  if (!bVar1) {
    testing::Message::Message(&local_a20);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a10);
    testing::internal::AssertHelper::AssertHelper
              (&local_a28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap_test.cpp"
               ,0x1a4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a28,&local_a20);
    testing::internal::AssertHelper::~AssertHelper(&local_a28);
    testing::Message::~Message(&local_a20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a10);
  event_base_free((event_base *)
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl);
  Message::~Message((Message *)&gtest_ar_3.message_);
  Coap::~Coap((Coap *)&gtest_ar_2.message_);
  Coap::~Coap((Coap *)&coap1.mEndpoint);
  MockEndpoint::~MockEndpoint((MockEndpoint *)&coap0.mEndpoint);
  MockEndpoint::~MockEndpoint
            ((MockEndpoint *)
             ((long)&peer1.mSendQueue.c.
                     super__Deque_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  Address::~Address((Address *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(CoapTest, CoapMessageConfirmable_BasicSendRecv)
{
    Address localhost;
    EXPECT_EQ(localhost.Set("127.0.0.1"), ErrorCode::kNone);

    auto eventBase = event_base_new();
    EXPECT_NE(eventBase, nullptr);

    MockEndpoint peer0{eventBase, localhost, 5683};
    MockEndpoint peer1{eventBase, localhost, 5684};
    peer0.SetPeer(&peer1);
    peer1.SetPeer(&peer0);

    Coap coap0{eventBase, peer0};
    Coap coap1{eventBase, peer1};

    EXPECT_EQ(coap1.AddResource({"/hello",
                                 [&coap1](const Request &aRequest) {
                                     EXPECT_TRUE(aRequest.IsRequest());
                                     EXPECT_EQ(aRequest.GetType(), Type::kConfirmable);
                                     EXPECT_EQ(aRequest.GetCode(), Code::kGet);

                                     ContentFormat contentFormat;
                                     EXPECT_EQ(aRequest.GetContentFormat(contentFormat), ErrorCode::kNone);
                                     EXPECT_EQ(contentFormat, ContentFormat::kTextPlain);

                                     std::string uriPath;
                                     EXPECT_EQ(aRequest.GetUriPath(uriPath), ErrorCode::kNone);
                                     EXPECT_EQ(uriPath, "/hello");

                                     EXPECT_EQ(aRequest.GetPayloadAsString(), "hello, CoAP");

                                     Response response{Type::kAcknowledgment, Code::kContent};
                                     EXPECT_EQ(response.SetContentFormat(ContentFormat::kTextPlain), ErrorCode::kNone);
                                     response.Append("Ack...");
                                     EXPECT_EQ(coap1.SendResponse(aRequest, response), ErrorCode::kNone);
                                 }}),
              ErrorCode::kNone);

    Message request{Type::kConfirmable, Code::kGet};
    EXPECT_EQ(request.SetUriPath("/hello"), ErrorCode::kNone);
    EXPECT_EQ(request.SetContentFormat(ContentFormat::kTextPlain), ErrorCode::kNone);
    request.Append("hello, CoAP");

    coap0.SendRequest(request, [&eventBase](const Response *aResponse, Error aError) {
        EXPECT_NE(aResponse, nullptr);
        EXPECT_EQ(aError, ErrorCode::kNone);
        EXPECT_EQ(aResponse->GetType(), Type::kAcknowledgment);

        ContentFormat contentFormat;
        EXPECT_EQ(aResponse->GetContentFormat(contentFormat), ErrorCode::kNone);
        EXPECT_EQ(contentFormat, ContentFormat::kTextPlain);

        EXPECT_EQ(aResponse->GetPayloadAsString(), "Ack...");

        event_base_loopbreak(eventBase);
    });

    EXPECT_EQ(event_base_loop(eventBase, EVLOOP_NO_EXIT_ON_EMPTY), 0);
    event_base_free(eventBase);
}